

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.npatch.c
# Opt level: O2

void pnga_copy_patch(char *trans,Integer g_a,Integer *alo,Integer *ahi,Integer g_b,Integer *blo,
                    Integer *bhi)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  int iVar3;
  Integer IVar4;
  Integer grp;
  Integer *pIVar5;
  Integer IVar6;
  logical lVar7;
  ulong uVar8;
  ulong uVar9;
  byte *pbVar10;
  void *v;
  void *ptr;
  void *subscript;
  long lVar11;
  long lVar12;
  Integer IVar13;
  long *plVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  Integer *hi;
  Integer *lo;
  Integer IVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  byte *pbVar23;
  char *src_data_ptr;
  Integer andim;
  Integer bndim;
  Integer local_640;
  Integer local_638;
  Integer *local_630;
  byte *local_628;
  Integer local_620;
  long local_618;
  Integer atype;
  Integer los [7];
  undefined8 uStack_5d0;
  Integer lod [7];
  Integer his [7];
  Integer ld [7];
  Integer hid [7];
  Integer btype;
  Integer bld [7];
  Integer ald [7];
  Integer factor_data [7];
  Integer factor_idx2 [7];
  Integer bdims [7];
  Integer adims [7];
  Integer bvalue [7];
  
  iVar3 = _ga_sync_begin;
  uStack_5d0._4_4_ = _ga_sync_end;
  _ga_sync_begin = 1;
  _ga_sync_end = _ga_sync_begin;
  local_640 = g_a;
  local_628 = (byte *)trans;
  IVar4 = pnga_get_pgroup(g_a);
  local_638 = g_b;
  grp = pnga_get_pgroup(g_b);
  pIVar5 = (Integer *)pnga_pgroup_nodeid(IVar4);
  local_630 = (Integer *)pnga_pgroup_nodeid(grp);
  local_618 = pnga_get_pgroup_size(IVar4);
  local_620 = pnga_get_pgroup_size(grp);
  if (iVar3 != 0) {
    IVar13 = IVar4;
    if (((local_620 < local_618) && (IVar6 = pnga_pgroup_get_world(), IVar13 = grp, IVar4 == IVar6))
       && (IVar6 = pnga_pgroup_get_world(), grp == IVar6)) {
      pnga_sync();
    }
    else {
      pnga_pgroup_sync(IVar13);
    }
  }
  IVar6 = local_640;
  pnga_inquire(local_640,&atype,&andim,adims);
  IVar18 = local_638;
  pnga_inquire(local_638,&btype,&bndim,bdims);
  IVar13 = andim;
  if (IVar6 == IVar18) {
    lVar7 = pnga_comp_patch(andim,alo,ahi,bndim,blo,bhi);
    if (lVar7 != 0) {
      return;
    }
    lVar7 = pnga_patch_intersect(alo,ahi,blo,bhi,IVar13);
    if (lVar7 != 0) {
      pnga_error("array patches cannot overlap ",0);
    }
  }
  if (CONCAT44(atype._4_4_,(int)atype) != btype) {
    pnga_error("array type mismatch ",0);
  }
  for (lVar15 = 0; lVar15 < andim; lVar15 = lVar15 + 1) {
    if ((alo[lVar15] < 1) || (adims[lVar15] < ahi[lVar15])) {
      pnga_error("g_a indices out of range ",0);
    }
  }
  for (lVar15 = 0; lVar15 < bndim; lVar15 = lVar15 + 1) {
    if ((blo[lVar15] < 1) || (bdims[lVar15] < bhi[lVar15])) {
      pnga_error("g_b indices out of range ",0);
    }
  }
  lVar15 = 0;
  IVar13 = andim;
  if (andim < 1) {
    IVar13 = lVar15;
  }
  lVar11 = 1;
  for (; IVar13 != lVar15; lVar15 = lVar15 + 1) {
    lVar11 = lVar11 * ((ahi[lVar15] - alo[lVar15]) + 1);
  }
  lVar15 = 0;
  IVar13 = bndim;
  if (bndim < 1) {
    IVar13 = lVar15;
  }
  lVar17 = 1;
  for (; IVar13 != lVar15; lVar15 = lVar15 + 1) {
    lVar17 = lVar17 * ((bhi[lVar15] - blo[lVar15]) + 1);
  }
  if (lVar11 != lVar17) {
    pnga_error("capacities two of patches do not match ",0);
  }
  uVar8 = pnga_total_blocks(local_640);
  uVar9 = pnga_total_blocks(local_638);
  if (-1 < (long)(uVar8 & uVar9)) {
    if ((*local_628 | 0x20) != 0x6e) {
      pnga_error("Transpose option not supported for block-cyclic data",0);
    }
    lVar7 = snga_test_shape(alo,ahi,blo,bhi,andim,bndim);
    if (lVar7 == 0) {
      pnga_error("Change in shape not supported for block-cyclic data",0);
    }
  }
  IVar6 = local_638;
  IVar13 = local_640;
  if ((long)(uVar8 & uVar9) < 0) {
    if (local_620 < local_618) {
      pnga_distribution(local_638,(Integer)local_630,los,his);
      hi = bhi;
      lo = blo;
      IVar18 = bndim;
      IVar13 = IVar6;
    }
    else {
      pnga_distribution(local_640,(Integer)pIVar5,los,his);
      hi = ahi;
      lo = alo;
      IVar18 = andim;
    }
    lVar7 = pnga_patch_intersect(lo,hi,los,his,IVar18);
    if (lVar7 == 0) goto LAB_0011f01e;
    pnga_access_ptr(IVar13,los,his,&src_data_ptr,ld);
    IVar6 = bndim;
    IVar13 = andim;
    lVar11 = 0;
    lVar15 = 0;
    if (0 < andim) {
      lVar15 = andim;
    }
    lVar17 = 1;
    for (; lVar15 != lVar11; lVar11 = lVar11 + 1) {
      lVar17 = lVar17 * ((his[lVar11] - los[lVar11]) + 1);
    }
    for (lVar11 = 0; lVar15 != lVar11; lVar11 = lVar11 + 1) {
      ald[lVar11] = (ahi[lVar11] - alo[lVar11]) + 1;
    }
    lVar12 = 0;
    lVar11 = 0;
    if (0 < bndim) {
      lVar11 = bndim;
    }
    for (; lVar11 != lVar12; lVar12 = lVar12 + 1) {
      bld[lVar12] = (bhi[lVar12] - blo[lVar12]) + 1;
    }
    lVar11 = 1;
    lVar16 = 0;
    for (lVar12 = 0; lVar15 != lVar12; lVar12 = lVar12 + 1) {
      lVar16 = lVar16 + los[lVar12] * lVar11;
      lVar11 = lVar11 * ld[lVar12];
    }
    if (((*local_628 | 0x20) != 0x6e) ||
       (lVar7 = snga_test_shape(alo,ahi,blo,bhi,andim,bndim), lVar7 == 0)) {
      v = pnga_malloc(lVar17,(int)atype,"v");
      ptr = pnga_malloc(andim * lVar17,0x3f2,"si");
      subscript = pnga_malloc(bndim * lVar17,0x3f2,"di");
      lVar15 = 0;
      if (0 < andim) {
        lVar15 = andim;
      }
      if (local_620 < local_618) {
        lVar11 = -1;
        while (lVar11 - lVar15 != -1) {
          bvalue[lVar11 + 1] = los[lVar11 + 1];
          lVar12 = lVar11 + 1;
          if (lVar12 == 0) {
            lod[0] = 1;
            lVar11 = lVar12;
          }
          else {
            lod[lVar12] = ((his[lVar11] - los[lVar11]) + 1) * lod[lVar11];
            lVar11 = lVar12;
          }
        }
        lVar11 = 0;
        lVar15 = 0;
        if (0 < lVar17) {
          lVar15 = lVar17;
        }
        lVar12 = 0;
        while (lVar12 != lVar15) {
          lVar12 = lVar12 + 1;
          for (lVar19 = 0; lVar19 < bndim; lVar19 = lVar19 + 1) {
            lVar21 = bvalue[lVar19];
            *(long *)((long)ptr + lVar19 * 8 + bndim * lVar11) = lVar21;
            if (lVar12 % lod[lVar19] == 0) {
              lVar21 = lVar21 + 1;
              bvalue[lVar19] = lVar21;
            }
            if (his[lVar19] < lVar21) {
              bvalue[lVar19] = los[lVar19];
            }
          }
          lVar11 = lVar11 + 8;
        }
        hid[0] = 1;
        lVar11 = 1;
        for (lVar12 = lVar11; lVar12 < bndim; lVar12 = lVar12 + 1) {
          lVar11 = lVar11 * bld[lVar12 + -1];
          hid[lVar12] = lVar11;
        }
        factor_idx2[bndim + -1] = 1;
        lVar12 = 1;
        for (lVar11 = bndim + -2; -1 < lVar11; lVar11 = lVar11 + -1) {
          lVar12 = lVar12 * bld[lVar11 + 1];
          factor_idx2[lVar11] = lVar12;
        }
        factor_data[0] = 1;
        lVar11 = 1;
        for (lVar12 = lVar11; lVar12 < bndim; lVar12 = lVar12 + 1) {
          lVar11 = lVar11 * ld[lVar12 + -1];
          factor_data[lVar12] = lVar11;
        }
        local_630 = (Integer *)((long)ptr + -8);
        lVar11 = 0;
        for (lVar12 = 0; lVar12 != lVar15; lVar12 = lVar12 + 1) {
          if ((*local_628 | 0x20) == 0x6e) {
            lVar21 = 0;
            if (0 < andim) {
              lVar21 = andim;
            }
            lVar19 = 0;
            for (lVar20 = 0; lVar21 != lVar20; lVar20 = lVar20 + 1) {
              lVar19 = lVar19 + (*(long *)((long)ptr + lVar20 * 8 + bndim * lVar11) - blo[lVar20]) *
                                hid[lVar20];
            }
          }
          else {
            lVar19 = 0;
            for (IVar13 = andim; 0 < IVar13; IVar13 = IVar13 + -1) {
              lVar19 = lVar19 + (*(long *)((long)local_630 + IVar13 * 8 + bndim * lVar11) -
                                blo[IVar13 + -1]) * factor_idx2[IVar13 + -1];
            }
          }
          for (lVar21 = 0; lVar21 < andim; lVar21 = lVar21 + 1) {
            lVar20 = ald[lVar21];
            *(long *)((long)subscript + lVar21 * 8 + bndim * lVar11) = lVar19 % lVar20 + alo[lVar21]
            ;
            lVar19 = lVar19 / lVar20;
          }
          lVar19 = 0;
          if (0 < bndim) {
            lVar19 = bndim;
          }
          lVar21 = 0;
          for (lVar20 = 0; lVar19 != lVar20; lVar20 = lVar20 + 1) {
            lVar21 = lVar21 + factor_data[lVar20] *
                              *(long *)((long)ptr + lVar20 * 8 + bndim * lVar11);
          }
          if (CONCAT44(atype._4_4_,(int)atype) - 0x3e9U < 0x10) {
            lVar21 = lVar21 - lVar16;
            switch(CONCAT44(atype._4_4_,(int)atype)) {
            case 0x3e9:
              *(undefined4 *)((long)v + lVar12 * 4) = *(undefined4 *)(src_data_ptr + lVar21 * 4);
              break;
            case 0x3ea:
            case 0x3ee:
            case 0x3f8:
              *(undefined8 *)((long)v + lVar12 * 8) = *(undefined8 *)(src_data_ptr + lVar21 * 8);
              break;
            case 0x3eb:
              *(undefined4 *)((long)v + lVar12 * 4) = *(undefined4 *)(src_data_ptr + lVar21 * 4);
              break;
            case 0x3ec:
              *(undefined8 *)((long)v + lVar12 * 8) = *(undefined8 *)(src_data_ptr + lVar21 * 8);
              break;
            case 0x3ef:
              uVar2 = *(undefined8 *)(src_data_ptr + lVar21 * 0x10 + 8);
              puVar1 = (undefined8 *)((long)v + lVar12 * 0x10);
              *puVar1 = *(undefined8 *)(src_data_ptr + lVar21 * 0x10);
              puVar1[1] = uVar2;
            }
          }
          lVar11 = lVar11 + 8;
        }
        pnga_release(local_638,los,his);
        pnga_gather(local_640,v,subscript,0,lVar17);
      }
      else {
        lVar11 = -1;
        while (lVar11 - lVar15 != -1) {
          bvalue[lVar11 + 1] = los[lVar11 + 1];
          lVar12 = lVar11 + 1;
          if (lVar12 == 0) {
            lod[0] = 1;
            lVar11 = lVar12;
          }
          else {
            lod[lVar12] = ((his[lVar11] - los[lVar11]) + 1) * lod[lVar11];
            lVar11 = lVar12;
          }
        }
        lVar11 = 0;
        lVar15 = 0;
        if (0 < lVar17) {
          lVar15 = lVar17;
        }
        lVar12 = 0;
        while (lVar12 != lVar15) {
          lVar12 = lVar12 + 1;
          for (lVar19 = 0; lVar19 < andim; lVar19 = lVar19 + 1) {
            lVar21 = bvalue[lVar19];
            *(long *)((long)ptr + lVar19 * 8 + andim * lVar11) = lVar21;
            if (lVar12 % lod[lVar19] == 0) {
              lVar21 = lVar21 + 1;
              bvalue[lVar19] = lVar21;
            }
            if (his[lVar19] < lVar21) {
              bvalue[lVar19] = los[lVar19];
            }
          }
          lVar11 = lVar11 + 8;
        }
        hid[0] = 1;
        lVar11 = 1;
        for (lVar12 = lVar11; lVar12 < andim; lVar12 = lVar12 + 1) {
          lVar11 = lVar11 * ald[lVar12 + -1];
          hid[lVar12] = lVar11;
        }
        factor_idx2[andim + -1] = 1;
        lVar12 = 1;
        for (lVar11 = andim + -2; -1 < lVar11; lVar11 = lVar11 + -1) {
          lVar12 = lVar12 * ald[lVar11 + 1];
          factor_idx2[lVar11] = lVar12;
        }
        factor_data[0] = 1;
        lVar11 = 1;
        for (lVar12 = lVar11; lVar12 < andim; lVar12 = lVar12 + 1) {
          lVar11 = lVar11 * ld[lVar12 + -1];
          factor_data[lVar12] = lVar11;
        }
        local_630 = (Integer *)((long)ptr + -8);
        lVar11 = 8;
        lVar12 = 0;
        for (lVar19 = 0; lVar19 != lVar15; lVar19 = lVar19 + 1) {
          if ((*local_628 | 0x20) == 0x6e) {
            lVar20 = 0;
            if (0 < andim) {
              lVar20 = andim;
            }
            lVar21 = 0;
            for (lVar22 = 0; lVar20 != lVar22; lVar22 = lVar22 + 1) {
              lVar21 = lVar21 + (*(long *)((long)ptr + lVar22 * 8 + andim * lVar12) - alo[lVar22]) *
                                hid[lVar22];
            }
          }
          else {
            plVar14 = (long *)(andim * lVar11 + (long)local_630);
            lVar21 = 0;
            for (IVar13 = andim; 0 < IVar13; IVar13 = IVar13 + -1) {
              lVar21 = lVar21 + (*plVar14 - alo[IVar13 + -1]) * factor_idx2[IVar13 + -1];
              plVar14 = plVar14 + -1;
            }
          }
          for (lVar20 = 0; lVar20 < bndim; lVar20 = lVar20 + 1) {
            lVar22 = bld[lVar20];
            *(long *)((long)subscript + lVar20 * 8 + bndim * lVar12) = lVar21 % lVar22 + blo[lVar20]
            ;
            lVar21 = lVar21 / lVar22;
          }
          lVar21 = 0;
          if (0 < andim) {
            lVar21 = andim;
          }
          lVar20 = 0;
          for (lVar22 = 0; lVar21 != lVar22; lVar22 = lVar22 + 1) {
            lVar20 = lVar20 + factor_data[lVar22] *
                              *(long *)((long)ptr + lVar22 * 8 + andim * lVar12);
          }
          if (CONCAT44(atype._4_4_,(int)atype) - 0x3e9U < 0x10) {
            lVar20 = lVar20 - lVar16;
            switch(CONCAT44(atype._4_4_,(int)atype)) {
            case 0x3e9:
              *(undefined4 *)((long)v + lVar19 * 4) = *(undefined4 *)(src_data_ptr + lVar20 * 4);
              break;
            case 0x3ea:
            case 0x3ee:
            case 0x3f8:
              *(undefined8 *)((long)v + lVar19 * 8) = *(undefined8 *)(src_data_ptr + lVar20 * 8);
              break;
            case 0x3eb:
              *(undefined4 *)((long)v + lVar19 * 4) = *(undefined4 *)(src_data_ptr + lVar20 * 4);
              break;
            case 0x3ec:
              *(undefined8 *)((long)v + lVar19 * 8) = *(undefined8 *)(src_data_ptr + lVar20 * 8);
              break;
            case 0x3ef:
              uVar2 = *(undefined8 *)(src_data_ptr + lVar20 * 0x10 + 8);
              puVar1 = (undefined8 *)((long)v + lVar19 * 0x10);
              *puVar1 = *(undefined8 *)(src_data_ptr + lVar20 * 0x10);
              puVar1[1] = uVar2;
            }
          }
          lVar12 = lVar12 + 8;
          lVar11 = lVar11 + 8;
        }
        pnga_release(local_640,los,his);
        pnga_scatter(local_638,v,subscript,0,lVar17);
      }
      pnga_free(subscript);
      pnga_free(ptr);
      pnga_free(v);
      goto LAB_0011f01e;
    }
    if (local_620 < local_618) {
      snga_dest_indices(IVar6,los,blo,bld,(Integer)lod,alo,ald,pIVar5);
      snga_dest_indices(IVar6,his,blo,bld,(Integer)hid,alo,ald,pIVar5);
      pnga_get(local_640,lod,hid,src_data_ptr,ld);
      IVar13 = local_638;
    }
    else {
      snga_dest_indices(IVar13,los,alo,ald,(Integer)lod,blo,bld,pIVar5);
      snga_dest_indices(IVar13,his,alo,ald,(Integer)hid,blo,bld,pIVar5);
      pnga_put(local_638,lod,hid,src_data_ptr,ld);
      IVar13 = local_640;
    }
  }
  else {
    lVar15 = 0;
    IVar13 = andim;
    if (andim < 1) {
      IVar13 = lVar15;
    }
    for (; IVar13 != lVar15; lVar15 = lVar15 + 1) {
      ald[lVar15] = (ahi[lVar15] - alo[lVar15]) + 1;
    }
    pbVar10 = (byte *)0x0;
    pbVar23 = (byte *)bndim;
    if (bndim < 1) {
      pbVar23 = pbVar10;
    }
    for (; pbVar23 != pbVar10; pbVar10 = pbVar10 + 1) {
      bld[(long)pbVar10] = (bhi[(long)pbVar10] - blo[(long)pbVar10]) + 1;
    }
    if (local_620 < local_618) {
      if (-1 < (long)uVar9) {
        pnga_local_iterator_init(local_638,(_iterator_hdl *)bvalue);
        local_628 = pbVar23;
        while (iVar3 = pnga_local_iterator_next((_iterator_hdl *)bvalue,los,his,&src_data_ptr,ld),
              IVar13 = andim, iVar3 != 0) {
          lVar15 = 0;
          if (0 < andim) {
            lVar15 = andim;
          }
          for (lVar11 = 0; lVar15 != lVar11; lVar11 = lVar11 + 1) {
            lod[lVar11] = los[lVar11];
            hid[lVar11] = his[lVar11];
          }
          lVar7 = pnga_patch_intersect(blo,bhi,los,his,andim);
          IVar6 = bndim;
          if (lVar7 != 0) {
            lVar15 = IVar13 + -1;
            if (lVar15 < 1) {
              lVar15 = 0;
            }
            lVar17 = 0;
            lVar11 = 1;
            for (lVar12 = 0; lVar15 != lVar12; lVar12 = lVar12 + 1) {
              lVar17 = lVar17 + (los[lVar12] - lod[lVar12]) * lVar11;
              lVar11 = lVar11 * ld[lVar12];
            }
            if (CONCAT44(atype._4_4_,(int)atype) - 0x3e9U < 0x10) {
              lVar17 = (los[IVar13 + -1] - (&uStack_5d0)[IVar13]) * lVar11 + lVar17;
              switch(CONCAT44(atype._4_4_,(int)atype)) {
              case 0x3e9:
              case 0x3eb:
                src_data_ptr = src_data_ptr + lVar17 * 4;
                break;
              case 0x3ea:
              case 0x3ec:
              case 0x3ee:
              case 0x3f8:
                src_data_ptr = src_data_ptr + lVar17 * 8;
                break;
              default:
                goto switchD_0011e1eb_caseD_3ed;
              case 0x3ef:
                src_data_ptr = src_data_ptr + lVar17 * 0x10;
              }
            }
            else {
switchD_0011e1eb_caseD_3ed:
            }
            pIVar5 = (Integer *)src_data_ptr;
            snga_dest_indices(bndim,los,blo,bld,(Integer)lod,alo,ald,(Integer *)src_data_ptr);
            snga_dest_indices(IVar6,his,blo,bld,(Integer)hid,alo,ald,pIVar5);
            pnga_get(local_640,lod,hid,pIVar5,ld);
            pnga_release_block(local_638,(Integer)local_628);
          }
        }
        goto LAB_0011f01e;
      }
      pnga_distribution(local_638,(Integer)local_630,los,his);
      lVar7 = pnga_patch_intersect(blo,bhi,los,his,bndim);
      IVar13 = local_638;
      if (lVar7 == 0) goto LAB_0011f01e;
      pnga_access_ptr(local_638,los,his,&src_data_ptr,ld);
      snga_dest_indices(bndim,los,blo,bld,(Integer)lod,alo,ald,pIVar5);
      snga_dest_indices(bndim,his,blo,bld,(Integer)hid,alo,ald,pIVar5);
      pnga_get(local_640,lod,hid,src_data_ptr,ld);
    }
    else {
      if (-1 < (long)uVar8) {
        local_630 = ahi;
        pnga_local_iterator_init(local_640,(_iterator_hdl *)bvalue);
        local_628 = pbVar23;
        while (iVar3 = pnga_local_iterator_next((_iterator_hdl *)bvalue,los,his,&src_data_ptr,ld),
              IVar13 = andim, iVar3 != 0) {
          lVar15 = 0;
          if (0 < andim) {
            lVar15 = andim;
          }
          for (lVar11 = 0; lVar15 != lVar11; lVar11 = lVar11 + 1) {
            lod[lVar11] = los[lVar11];
            hid[lVar11] = his[lVar11];
          }
          lVar7 = pnga_patch_intersect(alo,local_630,los,his,andim);
          if (lVar7 != 0) {
            lVar15 = IVar13 + -1;
            if (lVar15 < 1) {
              lVar15 = 0;
            }
            lVar17 = 0;
            lVar11 = 1;
            for (lVar12 = 0; lVar15 != lVar12; lVar12 = lVar12 + 1) {
              lVar17 = lVar17 + (los[lVar12] - lod[lVar12]) * lVar11;
              lVar11 = lVar11 * ld[lVar12];
            }
            if (CONCAT44(atype._4_4_,(int)atype) - 0x3e9U < 0x10) {
              lVar17 = (los[IVar13 + -1] - (&uStack_5d0)[IVar13]) * lVar11 + lVar17;
              switch(CONCAT44(atype._4_4_,(int)atype)) {
              case 0x3e9:
              case 0x3eb:
                src_data_ptr = src_data_ptr + lVar17 * 4;
                break;
              case 0x3ea:
              case 0x3ec:
              case 0x3ee:
              case 0x3f8:
                src_data_ptr = src_data_ptr + lVar17 * 8;
                break;
              default:
                goto switchD_0011e5c4_caseD_3ed;
              case 0x3ef:
                src_data_ptr = src_data_ptr + lVar17 * 0x10;
              }
            }
            else {
switchD_0011e5c4_caseD_3ed:
            }
            pIVar5 = (Integer *)src_data_ptr;
            snga_dest_indices(IVar13,los,alo,ald,(Integer)lod,blo,bld,(Integer *)src_data_ptr);
            snga_dest_indices(IVar13,his,alo,ald,(Integer)hid,blo,bld,pIVar5);
            pnga_put(local_638,lod,hid,pIVar5,ld);
            pnga_release_block(local_640,(Integer)local_628);
          }
        }
        goto LAB_0011f01e;
      }
      pnga_distribution(local_640,(Integer)pIVar5,los,his);
      lVar7 = pnga_patch_intersect(alo,ahi,los,his,andim);
      IVar13 = local_640;
      if (lVar7 == 0) goto LAB_0011f01e;
      pnga_access_ptr(local_640,los,his,&src_data_ptr,ld);
      snga_dest_indices(andim,los,alo,ald,(Integer)lod,blo,bld,pIVar5);
      snga_dest_indices(andim,his,alo,ald,(Integer)hid,blo,bld,pIVar5);
      pnga_put(local_638,lod,hid,src_data_ptr,ld);
    }
  }
  pnga_release(IVar13,los,his);
LAB_0011f01e:
  if (uStack_5d0._4_4_ != 0) {
    IVar13 = IVar4;
    if (((local_620 < local_618) && (IVar6 = pnga_pgroup_get_world(), IVar13 = grp, IVar4 == IVar6))
       && (IVar4 = pnga_pgroup_get_world(), grp == IVar4)) {
      pnga_sync();
    }
    else {
      pnga_pgroup_sync(IVar13);
    }
  }
  return;
}

Assistant:

void pnga_copy_patch(char *trans,
                    Integer g_a, Integer *alo, Integer *ahi,
                    Integer g_b, Integer *blo, Integer *bhi)
{
  Integer i, j;
  Integer idx, factor;
  Integer atype, btype, andim, adims[MAXDIM], bndim, bdims[MAXDIM];
  Integer nelem;
  Integer atotal, btotal;
  Integer los[MAXDIM], his[MAXDIM];
  Integer lod[MAXDIM], hid[MAXDIM];
  Integer ld[MAXDIM], ald[MAXDIM], bld[MAXDIM];
  char *src_data_ptr, *tmp_ptr;
  Integer *src_idx_ptr, *dst_idx_ptr;
  Integer bvalue[MAXDIM], bunit[MAXDIM];
  Integer factor_idx1[MAXDIM], factor_idx2[MAXDIM], factor_data[MAXDIM];
  Integer base;
  Integer me_a, me_b;
  Integer a_grp, b_grp, anproc, bnproc;
  Integer num_blocks_a, num_blocks_b/*, chk*/;
  int use_put, has_intersection;
  int local_sync_begin,local_sync_end;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  a_grp = pnga_get_pgroup(g_a);
  b_grp = pnga_get_pgroup(g_b);
  me_a = pnga_pgroup_nodeid(a_grp);
  me_b = pnga_pgroup_nodeid(b_grp);
  anproc = pnga_get_pgroup_size(a_grp);
  bnproc = pnga_get_pgroup_size(b_grp);
  if (anproc <= bnproc) {
    use_put = 1;
  }  else {
    use_put = 0;
  }

  /*if (a_grp != b_grp)
    pnga_error("All matrices must be on same group for pnga_copy_patch", 0L); */
  if(local_sync_begin) {
    if (anproc <= bnproc) {
      pnga_pgroup_sync(a_grp);
    } else if (a_grp == pnga_pgroup_get_world() &&
        b_grp == pnga_pgroup_get_world()) {
      pnga_sync();
    } else {
      pnga_pgroup_sync(b_grp);
    }
  }


  pnga_inquire(g_a, &atype, &andim, adims);
  pnga_inquire(g_b, &btype, &bndim, bdims);

  if(g_a == g_b) {
    /* they are the same patch */
    if(pnga_comp_patch(andim, alo, ahi, bndim, blo, bhi)) {
        return;
    /* they are in the same GA, but not the same patch */
    } else if (pnga_patch_intersect(alo, ahi, blo, bhi, andim)) {
      pnga_error("array patches cannot overlap ", 0L);
    }
  }

  if(atype != btype ) pnga_error("array type mismatch ", 0L);

  /* check if patch indices and dims match */
  for(i=0; i<andim; i++)
    if(alo[i] <= 0 || ahi[i] > adims[i])
      pnga_error("g_a indices out of range ", 0L);
  for(i=0; i<bndim; i++)
    if(blo[i] <= 0 || bhi[i] > bdims[i])
      pnga_error("g_b indices out of range ", 0L);

  /* check if numbers of elements in two patches match each other */
  atotal = 1; btotal = 1;
  for(i=0; i<andim; i++) atotal *= (ahi[i] - alo[i] + 1);
  for(i=0; i<bndim; i++) btotal *= (bhi[i] - blo[i] + 1);
  if(atotal != btotal)
    pnga_error("capacities two of patches do not match ", 0L);

  /* additional restrictions that apply if one or both arrays use
     block-cyclic data distributions */
  num_blocks_a = pnga_total_blocks(g_a);
  num_blocks_b = pnga_total_blocks(g_b);
  if (num_blocks_a >= 0 || num_blocks_b >= 0) {
    if (!(*trans == 'n' || *trans == 'N')) {
      pnga_error("Transpose option not supported for block-cyclic data", 0L);
    }
    if (!snga_test_shape(alo, ahi, blo, bhi, andim, bndim)) {
      pnga_error("Change in shape not supported for block-cyclic data", 0L);
    }
  }

  if (num_blocks_a < 0 && num_blocks_b <0) {
    /* now find out cordinates of a patch of g_a that I own */
    if (use_put) {
      pnga_distribution(g_a, me_a, los, his);
    } else {
      pnga_distribution(g_b, me_b, los, his);
    }

    /* copy my share of data */
    if (use_put) {
      has_intersection = pnga_patch_intersect(alo, ahi, los, his, andim);
    } else {
      has_intersection = pnga_patch_intersect(blo, bhi, los, his, bndim);
    }
    if(has_intersection){
      if (use_put) {
        pnga_access_ptr(g_a, los, his, &src_data_ptr, ld); 
      } else {
        pnga_access_ptr(g_b, los, his, &src_data_ptr, ld); 
      }

      /* calculate the number of elements in the patch that I own */
      nelem = 1; for(i=0; i<andim; i++) nelem *= (his[i] - los[i] + 1);

      for(i=0; i<andim; i++) ald[i] = ahi[i] - alo[i] + 1;
      for(i=0; i<bndim; i++) bld[i] = bhi[i] - blo[i] + 1;

      base = 0; factor = 1;
      for(i=0; i<andim; i++) {
        base += los[i] * factor;
        factor *= ld[i];
      }

      /*** straight copy possible if there's no reshaping or transpose ***/
      if((*trans == 'n' || *trans == 'N') &&
          snga_test_shape(alo, ahi, blo, bhi, andim, bndim)) { 
        /* find source[lo:hi] --> destination[lo:hi] */
        if (use_put) {
          snga_dest_indices(andim, los, alo, ald, bndim, lod, blo, bld);
          snga_dest_indices(andim, his, alo, ald, bndim, hid, blo, bld);
          pnga_put(g_b, lod, hid, src_data_ptr, ld);
          pnga_release(g_a, los, his);
        } else {
          snga_dest_indices(bndim, los, blo, bld, andim, lod, alo, ald);
          snga_dest_indices(bndim, his, blo, bld, andim, hid, alo, ald);
          pnga_get(g_a, lod, hid, src_data_ptr, ld);
          pnga_release(g_b, los, his);
        }
        /*** due to generality of this transformation scatter is required ***/
      } else{
        if (use_put) {
          tmp_ptr = pnga_malloc(nelem, atype, "v");
          src_idx_ptr = (Integer*) pnga_malloc((andim*nelem), MT_F_INT, "si");
          dst_idx_ptr = (Integer*) pnga_malloc((bndim*nelem), MT_F_INT, "di");

          /* calculate the destination indices */

          /* given los and his, find indices for each elements
           * bvalue: starting index in each dimension
           * bunit: stride in each dimension
           */
          for (i=0; i<andim; i++) {
            bvalue[i] = los[i];
            if (i == 0) bunit[i] = 1;
            else bunit[i] = bunit[i-1] * (his[i-1] - los[i-1] + 1);
          }

          /* source indices */
          for (i=0; i<nelem; i++) {
            for (j=0; j<andim; j++){
              src_idx_ptr[i*andim+j] = bvalue[j];
              /* if the next element is the first element in
               * one dimension, increment the index by 1
               */
              if (((i+1) % bunit[j]) == 0) bvalue[j]++;
              /* if the index becomes larger than the upper
               * bound in one dimension, reset it.
               */
              if(bvalue[j] > his[j]) bvalue[j] = los[j];
            }
          }

          /* index factor: reshaping without transpose */
          factor_idx1[0] = 1;
          for (j=1; j<andim; j++) 
            factor_idx1[j] = factor_idx1[j-1] * ald[j-1];

          /* index factor: reshaping with transpose */
          factor_idx2[andim-1] = 1;
          for (j=(andim-1)-1; j>=0; j--)
            factor_idx2[j] = factor_idx2[j+1] * ald[j+1];

          /* data factor */
          factor_data[0] = 1;
          for (j=1; j<andim; j++) 
            factor_data[j] = factor_data[j-1] * ld[j-1];

          /* destination indices */
          for(i=0; i<nelem; i++) {
            /* linearize the n-dimensional indices to one dimension */
            idx = 0;
            if (*trans == 'n' || *trans == 'N')
              for (j=0; j<andim; j++) 
                idx += (src_idx_ptr[i*andim+j] - alo[j]) *
                  factor_idx1[j];
            else
              /* if the patch needs to be transposed, reverse
               * the indices: (i, j, ...) -> (..., j, i)
               */
              for (j=(andim-1); j>=0; j--) 
                idx += (src_idx_ptr[i*andim+j] - alo[j]) *
                  factor_idx2[j];

            /* convert the one dimensional index to n-dimensional
             * indices of destination
             */
            for (j=0; j<bndim; j++) {
              dst_idx_ptr[i*bndim+j] = idx % bld[j] + blo[j]; 
              idx /= bld[j];
            }

            /* move the data block to create a new block */
            /* linearize the data indices */
            idx = 0;
            for (j=0; j<andim; j++) 
              idx += (src_idx_ptr[i*andim+j]) * factor_data[j];

            /* adjust the position
             * base: starting address of the first element */
            idx -= base;

            /* move the element to the temporary location */
            switch(atype) {
              case C_DBL: ((double*)tmp_ptr)[i] =
                          ((double*)src_data_ptr)[idx]; 
                          break;
              case C_INT:
                          ((int *)tmp_ptr)[i] = ((int *)src_data_ptr)[idx];
                          break;
              case C_DCPL:((DoubleComplex *)tmp_ptr)[i] =
                          ((DoubleComplex *)src_data_ptr)[idx];
                          break;
              case C_SCPL:((SingleComplex *)tmp_ptr)[i] =
                          ((SingleComplex *)src_data_ptr)[idx];
                          break;
              case C_FLOAT: ((float *)tmp_ptr)[i] =
                            ((float *)src_data_ptr)[idx]; 
                          break;     
              case C_LONG: ((long *)tmp_ptr)[i] =
                           ((long *)src_data_ptr)[idx];
                          break;
              case C_LONGLONG: ((long long *)tmp_ptr)[i] =
                           ((long long *)src_data_ptr)[idx];     
            }
          }
          pnga_release(g_a, los, his);
          pnga_scatter(g_b, tmp_ptr, dst_idx_ptr, 0, nelem);
          pnga_free(dst_idx_ptr);
          pnga_free(src_idx_ptr);
          pnga_free(tmp_ptr);
        } else {
          tmp_ptr = pnga_malloc(nelem, atype, "v");
          src_idx_ptr = (Integer*) pnga_malloc((andim*nelem), MT_F_INT, "si");
          dst_idx_ptr = (Integer*) pnga_malloc((bndim*nelem), MT_F_INT, "di");

          /* calculate the destination indices */

          /* given los and his, find indices for each elements
           * bvalue: starting index in each dimension
           * bunit: stride in each dimension
           */
          for (i=0; i<andim; i++) {
            bvalue[i] = los[i];
            if (i == 0) bunit[i] = 1;
            else bunit[i] = bunit[i-1] * (his[i-1] - los[i-1] + 1);
          }

          /* destination indices */
          for (i=0; i<nelem; i++) {
            for (j=0; j<bndim; j++){
              src_idx_ptr[i*bndim+j] = bvalue[j];
              /* if the next element is the first element in
               * one dimension, increment the index by 1
               */
              if (((i+1) % bunit[j]) == 0) bvalue[j]++;
              /* if the index becomes larger than the upper
               * bound in one dimension, reset it.
               */
              if(bvalue[j] > his[j]) bvalue[j] = los[j];
            }
          }

          /* index factor: reshaping without transpose */
          factor_idx1[0] = 1;
          for (j=1; j<bndim; j++) 
            factor_idx1[j] = factor_idx1[j-1] * bld[j-1];

          /* index factor: reshaping with transpose */
          factor_idx2[bndim-1] = 1;
          for (j=(bndim-1)-1; j>=0; j--)
            factor_idx2[j] = factor_idx2[j+1] * bld[j+1];

          /* data factor */
          factor_data[0] = 1;
          for (j=1; j<bndim; j++) 
            factor_data[j] = factor_data[j-1] * ld[j-1];

          /* destination indices */
          for(i=0; i<nelem; i++) {
            /* linearize the n-dimensional indices to one dimension */
            idx = 0;
            if (*trans == 'n' || *trans == 'N')
              for (j=0; j<andim; j++) 
                idx += (src_idx_ptr[i*bndim+j] - blo[j]) *
                  factor_idx1[j];
            else
              /* if the patch needs to be transposed, reverse
               * the indices: (i, j, ...) -> (..., j, i)
               */
              for (j=(andim-1); j>=0; j--) 
                idx += (src_idx_ptr[i*bndim+j] - blo[j]) *
                  factor_idx2[j];

            /* convert the one dimensional index to n-dimensional
             * indices of destination
             */
            for (j=0; j<andim; j++) {
              dst_idx_ptr[i*bndim+j] = idx % ald[j] + alo[j]; 
              idx /= ald[j];
            }

            /* move the data block to create a new block */
            /* linearize the data indices */
            idx = 0;
            for (j=0; j<bndim; j++) 
              idx += (src_idx_ptr[i*bndim+j]) * factor_data[j];

            /* adjust the position
             * base: starting address of the first element */
            idx -= base;

            /* move the element to the temporary location */
            switch(atype) {
              case C_DBL: ((double*)tmp_ptr)[i] =
                          ((double*)src_data_ptr)[idx]; 
                          break;
              case C_INT:
                          ((int *)tmp_ptr)[i] = ((int *)src_data_ptr)[idx];
                          break;
              case C_DCPL:((DoubleComplex *)tmp_ptr)[i] =
                          ((DoubleComplex *)src_data_ptr)[idx];
                          break;
              case C_SCPL:((SingleComplex *)tmp_ptr)[i] =
                          ((SingleComplex *)src_data_ptr)[idx];
                          break;
              case C_FLOAT: ((float *)tmp_ptr)[i] =
                            ((float *)src_data_ptr)[idx]; 
                          break;
              case C_LONG: ((long *)tmp_ptr)[i] =
                           ((long *)src_data_ptr)[idx];     
                          break;
              case C_LONGLONG: ((long long *)tmp_ptr)[i] =
                           ((long long *)src_data_ptr)[idx];     
            }
          }
          pnga_release(g_b, los, his);
          pnga_gather(g_a, tmp_ptr, dst_idx_ptr, 0, nelem);
          pnga_free(dst_idx_ptr);
          pnga_free(src_idx_ptr);
          pnga_free(tmp_ptr);
        }
      }
    }
  } else {
    Integer offset, last, jtot;
    for (i=0; i<andim; i++) {
      ald[i] = ahi[i] - alo[i] + 1;
    }
    for (i=0; i<bndim; i++) {
      bld[i] = bhi[i] - blo[i] + 1;
    }
    if (use_put) {
      /* Array a is block-cyclic distributed */
      if (num_blocks_a >= 0) {
#if 1
        _iterator_hdl hdl_a;
        pnga_local_iterator_init(g_a, &hdl_a);
        while (pnga_local_iterator_next(&hdl_a, los, his,
              &src_data_ptr, ld)) {
            /* Copy limits since patch intersect modifies los array */
            for (j=0; j < andim; j++) {
              lod[j] = los[j];
              hid[j] = his[j];
            }
            if (pnga_patch_intersect(alo,ahi,los,his,andim)) {
              offset = 0;
              last = andim - 1;
              jtot = 1;
              for (j=0; j<last; j++) {
                offset += (los[j]-lod[j])*jtot;
                jtot *= ld[j];
              }
              offset += (los[last]-lod[last])*jtot;
              switch(atype) {
                case C_DBL:
                  src_data_ptr = (void*)((double*)(src_data_ptr) + offset); 
                  break;
                case C_INT:
                  src_data_ptr = (void*)((int*)(src_data_ptr) + offset); 
                  break;
                case C_DCPL:
                  src_data_ptr = (void*)((DoubleComplex*)(src_data_ptr) + offset); 
                  break;
                case C_SCPL:
                  src_data_ptr = (void*)((SingleComplex*)(src_data_ptr) + offset); 
                  break;
                case C_FLOAT:
                  src_data_ptr = (void*)((float*)(src_data_ptr) + offset); 
                  break;     
                case C_LONG:
                  src_data_ptr = (void*)((long*)(src_data_ptr) + offset); 
                  break;
                case C_LONGLONG:
                  src_data_ptr = (void*)((long long*)(src_data_ptr) + offset); 
                  break;
                default:
                  break;
              }
              snga_dest_indices(andim, los, alo, ald, bndim, lod, blo, bld);
              snga_dest_indices(andim, his, alo, ald, bndim, hid, blo, bld);
              pnga_put(g_b, lod, hid, src_data_ptr, ld);
              pnga_release_block(g_a, i);
            }
          }
#else
        /* Uses simple block-cyclic data distribution */
        if (!pnga_uses_proc_grid(g_a)) {
          for (i = me_a; i < num_blocks_a; i += anproc) {
            pnga_distribution(g_a, i, los, his); 
            /* make temporory copies of los, his since ngai_patch_intersection
               destroys original versions */
            for (j=0; j < andim; j++) {
              lod[j] = los[j];
              hid[j] = his[j];
            }
            if (pnga_patch_intersect(alo,ahi,los,his,andim)) {
              pnga_access_block_ptr(g_a, i, &src_data_ptr, ld);
              offset = 0;
              last = andim - 1;
              jtot = 1;
              for (j=0; j<last; j++) {
                offset += (los[j]-lod[j])*jtot;
                jtot *= ld[j];
              }
              offset += (los[last]-lod[last])*jtot;
              switch(atype) {
                case C_DBL:
                  src_data_ptr = (void*)((double*)(src_data_ptr) + offset); 
                  break;
                case C_INT:
                  src_data_ptr = (void*)((int*)(src_data_ptr) + offset); 
                  break;
                case C_DCPL:
                  src_data_ptr = (void*)((DoubleComplex*)(src_data_ptr) + offset); 
                  break;
                case C_SCPL:
                  src_data_ptr = (void*)((SingleComplex*)(src_data_ptr) + offset); 
                  break;
                case C_FLOAT:
                  src_data_ptr = (void*)((float*)(src_data_ptr) + offset); 
                  break;     
                case C_LONG:
                  src_data_ptr = (void*)((long*)(src_data_ptr) + offset); 
                  break;
                case C_LONGLONG:
                  src_data_ptr = (void*)((long long*)(src_data_ptr) + offset); 
                  break;
                default:
                  break;
              }
              snga_dest_indices(andim, los, alo, ald, bndim, lod, blo, bld);
              snga_dest_indices(andim, his, alo, ald, bndim, hid, blo, bld);
              pnga_put(g_b, lod, hid, src_data_ptr, ld);
              pnga_release_block(g_a, i);
            }
          }
        } else {
          /* Uses scalapack block-cyclic data distribution */
          Integer proc_index[MAXDIM], index[MAXDIM];
          Integer topology[MAXDIM];
          Integer blocks[MAXDIM], block_dims[MAXDIM];
          pnga_get_proc_index(g_a, me_a, proc_index);
          pnga_get_proc_index(g_a, me_a, index);
          pnga_get_block_info(g_a, blocks, block_dims);
          pnga_get_proc_grid(g_a, topology);
          while (index[andim-1] < blocks[andim-1]) {
            /* find bounding coordinates of block */
            /*chk = 1;*/
            for (i = 0; i < andim; i++) {
              los[i] = index[i]*block_dims[i]+1;
              his[i] = (index[i] + 1)*block_dims[i];
              if (his[i] > adims[i]) his[i] = adims[i];
              /*if (his[i] < los[i]) chk = 0;*/
            }
            /* make temperary copies of los, his since ngai_patch_intersection
               destroys original versions */
            for (j=0; j < andim; j++) {
              lod[j] = los[j];
              hid[j] = his[j];
            }
            if (pnga_patch_intersect(alo,ahi,los,his,andim)) {
              pnga_access_block_grid_ptr(g_a, index, &src_data_ptr, ld);
              offset = 0;
              last = andim - 1;
              jtot = 1;
              for (j=0; j<last; j++) {
                offset += (los[j]-lod[j])*jtot;
                jtot *= ld[j];
              }
              offset += (los[last]-lod[last])*jtot;
              switch(atype) {
                case C_DBL:
                  src_data_ptr = (void*)((double*)(src_data_ptr) + offset); 
                  break;
                case C_INT:
                  src_data_ptr = (void*)((int*)(src_data_ptr) + offset); 
                  break;
                case C_DCPL:
                  src_data_ptr = (void*)((DoubleComplex*)(src_data_ptr) + offset); 
                  break;
                case C_SCPL:
                  src_data_ptr = (void*)((SingleComplex*)(src_data_ptr) + offset); 
                  break;
                case C_FLOAT:
                  src_data_ptr = (void*)((float*)(src_data_ptr) + offset); 
                  break;     
                case C_LONG:
                  src_data_ptr = (void*)((long*)(src_data_ptr) + offset); 
                  break;
                case C_LONGLONG:
                  src_data_ptr = (void*)((long long*)(src_data_ptr) + offset); 
                  break;
                default:
                  break;
              }
              snga_dest_indices(andim, los, alo, ald, bndim, lod, blo, bld);
              snga_dest_indices(andim, his, alo, ald, bndim, hid, blo, bld);
              pnga_put(g_b, lod, hid, src_data_ptr, ld);
              pnga_release_block_grid(g_a, index);
            }

            /* increment index to get next block on processor */
            index[0] += topology[0];
            for (i = 0; i < andim; i++) {
              if (index[i] >= blocks[i] && i<andim-1) {
                index[i] = proc_index[i];
                index[i+1] += topology[i+1];
              }
            }
          }
        }
#endif
      } else {
        /* Only array b is block-cyclic distributed */
        pnga_distribution(g_a, me_a, los, his); 
        if (pnga_patch_intersect(alo,ahi,los,his,andim)) {
          pnga_access_ptr(g_a, los, his, &src_data_ptr, ld); 
          snga_dest_indices(andim, los, alo, ald, bndim, lod, blo, bld);
          snga_dest_indices(andim, his, alo, ald, bndim, hid, blo, bld);
          pnga_put(g_b, lod, hid, src_data_ptr, ld);
          pnga_release(g_a, los, his);
        }
      }
    } else {
      /* Array b is block-cyclic distributed */
      if (num_blocks_b >= 0) {
#if 1
        _iterator_hdl hdl_b;
        pnga_local_iterator_init(g_b, &hdl_b);
        while (pnga_local_iterator_next(&hdl_b, los, his,
              &src_data_ptr, ld)) {
            /* Copy limits since patch intersect modifies los array */
            for (j=0; j < andim; j++) {
              lod[j] = los[j];
              hid[j] = his[j];
            }
            if (pnga_patch_intersect(blo,bhi,los,his,andim)) {
              offset = 0;
              last = andim - 1;
              jtot = 1;
              for (j=0; j<last; j++) {
                offset += (los[j]-lod[j])*jtot;
                jtot *= ld[j];
              }
              offset += (los[last]-lod[last])*jtot;
              switch(atype) {
                case C_DBL:
                  src_data_ptr = (void*)((double*)(src_data_ptr) + offset); 
                  break;
                case C_INT:
                  src_data_ptr = (void*)((int*)(src_data_ptr) + offset); 
                  break;
                case C_DCPL:
                  src_data_ptr = (void*)((DoubleComplex*)(src_data_ptr) + offset); 
                  break;
                case C_SCPL:
                  src_data_ptr = (void*)((SingleComplex*)(src_data_ptr) + offset); 
                  break;
                case C_FLOAT:
                  src_data_ptr = (void*)((float*)(src_data_ptr) + offset); 
                  break;     
                case C_LONG:
                  src_data_ptr = (void*)((long*)(src_data_ptr) + offset); 
                  break;
                case C_LONGLONG:
                  src_data_ptr = (void*)((long long*)(src_data_ptr) + offset); 
                  break;
                default:
                  break;
              }
              snga_dest_indices(bndim, los, blo, bld, andim, lod, alo, ald);
              snga_dest_indices(bndim, his, blo, bld, andim, hid, alo, ald);
              pnga_get(g_a, lod, hid, src_data_ptr, ld);
              pnga_release_block(g_b, i);
            }
          }
#else
        /* Uses simple block-cyclic data distribution */
        if (!pnga_uses_proc_grid(g_b)) {
          for (i = me_b; i < num_blocks_b; i += bnproc) {
            pnga_distribution(g_b, i, los, his); 
            /* make temporory copies of los, his since ngai_patch_intersection
               destroys original versions */
            for (j=0; j < andim; j++) {
              lod[j] = los[j];
              hid[j] = his[j];
            }
            if (pnga_patch_intersect(blo,bhi,los,his,andim)) {
              pnga_access_block_ptr(g_b, i, &src_data_ptr, ld);
              offset = 0;
              last = bndim - 1;
              jtot = 1;
              for (j=0; j<last; j++) {
                offset += (los[j]-lod[j])*jtot;
                jtot *= ld[j];
              }
              offset += (los[last]-lod[last])*jtot;
              switch(atype) {
                case C_DBL:
                  src_data_ptr = (void*)((double*)(src_data_ptr) + offset); 
                  break;
                case C_INT:
                  src_data_ptr = (void*)((int*)(src_data_ptr) + offset); 
                  break;
                case C_DCPL:
                  src_data_ptr = (void*)((DoubleComplex*)(src_data_ptr) + offset); 
                  break;
                case C_SCPL:
                  src_data_ptr = (void*)((SingleComplex*)(src_data_ptr) + offset); 
                  break;
                case C_FLOAT:
                  src_data_ptr = (void*)((float*)(src_data_ptr) + offset); 
                  break;     
                case C_LONG:
                  src_data_ptr = (void*)((long*)(src_data_ptr) + offset); 
                  break;
                case C_LONGLONG:
                  src_data_ptr = (void*)((long long*)(src_data_ptr) + offset); 
                  break;
                default:
                  break;
              }
              snga_dest_indices(bndim, los, blo, bld, andim, lod, alo, ald);
              snga_dest_indices(bndim, his, blo, bld, andim, hid, alo, ald);
              pnga_get(g_a, lod, hid, src_data_ptr, ld);
              pnga_release_block(g_b, i);
            }
          }
        } else {
          /* Uses scalapack block-cyclic data distribution */
          Integer proc_index[MAXDIM], index[MAXDIM];
          Integer topology[MAXDIM];
          Integer blocks[MAXDIM], block_dims[MAXDIM];
          pnga_get_proc_index(g_b, me_b, proc_index);
          pnga_get_proc_index(g_b, me_b, index);
          pnga_get_block_info(g_b, blocks, block_dims);
          pnga_get_proc_grid(g_b, topology);
          while (index[bndim-1] < blocks[bndim-1]) {
            /* find bounding coordinates of block */
            /*chk = 1;*/
            for (i = 0; i < bndim; i++) {
              los[i] = index[i]*block_dims[i]+1;
              his[i] = (index[i] + 1)*block_dims[i];
              if (his[i] > bdims[i]) his[i] = bdims[i];
              /*if (his[i] < los[i]) chk = 0;*/
            }
            /* make temporory copies of los, his since ngai_patch_intersection
               destroys original versions */
            for (j=0; j < andim; j++) {
              lod[j] = los[j];
              hid[j] = his[j];
            }
            if (pnga_patch_intersect(blo,bhi,los,his,andim)) {
              pnga_access_block_grid_ptr(g_b, index, &src_data_ptr, ld);
              offset = 0;
              last = bndim - 1;
              jtot = 1;
              for (j=0; j<last; j++) {
                offset += (los[j]-lod[j])*jtot;
                jtot *= ld[j];
              }
              offset += (los[last]-lod[last])*jtot;
              switch(atype) {
                case C_DBL:
                  src_data_ptr = (void*)((double*)(src_data_ptr) + offset); 
                  break;
                case C_INT:
                  src_data_ptr = (void*)((int*)(src_data_ptr) + offset); 
                  break;
                case C_DCPL:
                  src_data_ptr = (void*)((DoubleComplex*)(src_data_ptr) + offset); 
                  break;
                case C_SCPL:
                  src_data_ptr = (void*)((SingleComplex*)(src_data_ptr) + offset); 
                  break;
                case C_FLOAT:
                  src_data_ptr = (void*)((float*)(src_data_ptr) + offset); 
                  break;     
                case C_LONG:
                  src_data_ptr = (void*)((long*)(src_data_ptr) + offset); 
                  break;
                case C_LONGLONG:
                  src_data_ptr = (void*)((long long*)(src_data_ptr) + offset); 
                  break;
                default:
                  break;
              }
              snga_dest_indices(bndim, los, blo, bld, andim, lod, alo, ald);
              snga_dest_indices(bndim, his, blo, bld, andim, hid, alo, ald);
              pnga_get(g_a, lod, hid, src_data_ptr, ld);
              pnga_release_block_grid(g_b, index);
            }

            /* increment index to get next block on processor */
            index[0] += topology[0];
            for (i = 0; i < bndim; i++) {
              if (index[i] >= blocks[i] && i<bndim-1) {
                index[i] = proc_index[i];
                index[i+1] += topology[i+1];
              }
            }
          }
        }
#endif
      } else {
        /* Array a is block-cyclic distributed */
        pnga_distribution(g_b, me_b, los, his); 
        if (pnga_patch_intersect(blo,bhi,los,his,bndim)) {
          pnga_access_ptr(g_b, los, his, &src_data_ptr, ld); 
          snga_dest_indices(bndim, los, blo, bld, andim, lod, alo, ald);
          snga_dest_indices(bndim, his, blo, bld, andim, hid, alo, ald);
          pnga_get(g_a, lod, hid, src_data_ptr, ld);
          pnga_release(g_b, los, his);
        }
      }
    }
  }
  /* ARMCI_AllFence(); */
  if(local_sync_end) {
    if (anproc <= bnproc) {
      pnga_pgroup_sync(a_grp);
    } else if (a_grp == pnga_pgroup_get_world() &&
        b_grp == pnga_pgroup_get_world()) {
      pnga_sync();
    } else {
      pnga_pgroup_sync(b_grp);
    }
  }
}